

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O3

void enable_dma(char *pci_addr)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  __off_t _Var6;
  ssize_t sVar7;
  char *__addr;
  void *vaddr;
  ulong uVar8;
  undefined8 extraout_RAX;
  long *plVar9;
  uintptr_t *puVar10;
  undefined8 extraout_RAX_00;
  ulong extraout_RDX;
  long lVar11;
  undefined1 *__len;
  char cVar12;
  ushort *__buf;
  long *__buf_00;
  long *plVar13;
  ulong uVar14;
  char *unaff_R14;
  uintptr_t *virt;
  ulong uVar15;
  dma_memory dVar16;
  uint16_t dma;
  char buf [512];
  char path [4096];
  undefined8 uVar17;
  long *plVar18;
  long alStack_2660 [66];
  undefined1 *puStack_2450;
  char *pcStack_2448;
  long alStack_2430 [64];
  char acStack_2230 [4096];
  ulong uStack_1230;
  ushort local_120a;
  undefined1 local_1208 [512];
  char local_1008 [4096];
  
  snprintf(local_1008,0x1000,"/sys/bus/pci/devices/%s/config",pci_addr);
  uVar3 = open(local_1008,2);
  if (uVar3 == 0xffffffff) {
    enable_dma_cold_2();
LAB_00104b5f:
    __assert_fail("lseek(fd, 4, SEEK_SET) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x20,
                  "void enable_dma(const char *)");
  }
  _Var6 = lseek(uVar3,4,0);
  if (_Var6 != 4) goto LAB_00104b5f;
  local_120a = 0;
  sVar7 = read(uVar3,&local_120a,2);
  if (sVar7 != 2) {
    __assert_fail("read(fd, &dma, 2) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x22,
                  "void enable_dma(const char *)");
  }
  local_120a = local_120a | 4;
  _Var6 = lseek(uVar3,4,0);
  if (_Var6 != 4) {
    __assert_fail("lseek(fd, 4, SEEK_SET) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x24,
                  "void enable_dma(const char *)");
  }
  __buf = &local_120a;
  sVar7 = write(uVar3,__buf,2);
  cVar12 = (char)__buf;
  if (sVar7 != 2) {
    __assert_fail("write(fd, &dma, 2) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x25,
                  "void enable_dma(const char *)");
  }
  iVar4 = close(uVar3);
  if (iVar4 != -1) {
    return;
  }
  __len = local_1208;
  enable_dma_cold_1();
  plVar9 = alStack_2430;
  uStack_1230 = (ulong)uVar3;
  if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via huge page\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x39,
            "memory_allocate_dma");
    uVar2 = huge_pg_id;
    __len = (undefined1 *)((ulong)(__len + 0x1fffff) & 0xffffffffffe00000);
    if (cVar12 == '\x01' && (undefined1 *)0x200000 < __len) {
      memory_allocate_dma_cold_6();
      goto LAB_00104d7f;
    }
    LOCK();
    huge_pg_id = huge_pg_id + 1;
    UNLOCK();
    uVar3 = getpid();
    unaff_R14 = acStack_2230;
    snprintf(unaff_R14,0x1000,"/mnt/huge/ixy-%d-%d",(ulong)uVar3,(ulong)uVar2);
    iVar4 = open(unaff_R14,0x42,0x1c0);
    if (iVar4 == -1) goto LAB_00104d8c;
    iVar5 = ftruncate(iVar4,(__off_t)__len);
    if (iVar5 == -1) goto LAB_00104d94;
    __addr = (char *)mmap((void *)0x0,(size_t)__len,3,0x40001,iVar4,0);
    if (__addr == (char *)0xffffffffffffffff) goto LAB_00104d9c;
    iVar5 = mlock(__addr,(size_t)__len);
    if (iVar5 != -1) {
      close(iVar4);
      unlink(acStack_2230);
      virt_to_phys(__addr);
      return;
    }
  }
  else {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): allocating dma memory via VFIO\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x2f,
            "memory_allocate_dma");
    vaddr = mmap((void *)0x0,(size_t)__len,3,0x54040021,-1,0);
    if (vaddr != (void *)0xffffffffffffffff) {
      vfio_map_dma(vaddr,(uint32_t)__len);
      return;
    }
LAB_00104d7f:
    memory_allocate_dma_cold_1();
LAB_00104d8c:
    memory_allocate_dma_cold_5();
LAB_00104d94:
    memory_allocate_dma_cold_4();
LAB_00104d9c:
    __addr = unaff_R14;
    memory_allocate_dma_cold_3();
  }
  memory_allocate_dma_cold_2();
  puStack_2450 = __len;
  pcStack_2448 = __addr;
  uVar8 = sysconf(0x1e);
  __buf_00 = (long *)0x0;
  iVar4 = open("/proc/self/pagemap",0);
  if (iVar4 == -1) {
    virt_to_phys_cold_4();
LAB_00104e5a:
    virt_to_phys_cold_3();
  }
  else {
    __buf_00 = (long *)(((ulong)plVar9 / uVar8) * 8);
    _Var6 = lseek(iVar4,(__off_t)__buf_00,0);
    if (_Var6 == -1) goto LAB_00104e5a;
    __buf_00 = alStack_2660;
    alStack_2660[0] = 0;
    sVar7 = read(iVar4,__buf_00,8);
    if (sVar7 != -1) {
      close(iVar4);
      if (alStack_2660[0] != 0) {
        return;
      }
      goto LAB_00104e6e;
    }
  }
  virt_to_phys_cold_2();
LAB_00104e6e:
  plVar13 = plVar9;
  virt_to_phys_cold_1();
  uVar15 = 0x800;
  if ((int)__buf_00 != 0) {
    uVar15 = (ulong)__buf_00 & 0xffffffff;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % uVar15) != 0)) {
    uVar17 = extraout_RAX;
    plVar18 = plVar9;
    memory_allocate_mempool_cold_1();
    uVar3 = *(uint *)(plVar13 + 2);
    uVar14 = extraout_RDX & 0xffffffff;
    uVar15 = (ulong)uVar3;
    if (uVar3 < (uint)extraout_RDX) {
      fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
              "pkt_buf_alloc_batch",plVar13,(ulong)uVar3,uVar14,extraout_RAX_00,plVar9,uVar8,uVar17,
              plVar18);
      uVar14 = (ulong)*(uint *)(plVar13 + 2);
      uVar15 = uVar14;
    }
    if ((int)uVar14 != 0) {
      lVar1 = plVar13[1];
      lVar11 = 0;
      do {
        uVar3 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar3;
        *(ulong *)((long)__buf_00 + lVar11) =
             (ulong)(uint)(*(int *)((long)plVar13 + uVar15 * 4 + 0x14) * (int)lVar1) + *plVar13;
        lVar11 = lVar11 + 8;
      } while (uVar14 << 3 != lVar11);
      *(uint *)(plVar13 + 2) = uVar3;
    }
    return;
  }
  iVar4 = (int)plVar13;
  plVar9 = (long *)malloc(((ulong)plVar13 & 0xffffffff) * 4 + 0x18);
  iVar5 = (int)uVar15;
  uVar3 = 0;
  dVar16 = memory_allocate_dma((ulong)(uint)(iVar5 * iVar4),false);
  *(int *)((long)plVar9 + 0xc) = iVar4;
  *(int *)(plVar9 + 1) = iVar5;
  *plVar9 = (long)dVar16.virt;
  *(int *)(plVar9 + 2) = iVar4;
  if (iVar4 != 0) {
    uVar8 = 0;
    do {
      *(int *)((long)plVar9 + uVar8 * 4 + 0x14) = (int)uVar8;
      virt = (uintptr_t *)((ulong)uVar3 + *plVar9);
      puVar10 = virt;
      if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
        puVar10 = (uintptr_t *)virt_to_phys(virt);
      }
      *virt = (uintptr_t)puVar10;
      *(int *)(virt + 2) = (int)uVar8;
      uVar8 = uVar8 + 1;
      uVar3 = uVar3 + iVar5;
      virt[1] = (uintptr_t)plVar9;
      *(undefined4 *)((long)virt + 0x14) = 0;
    } while (((ulong)plVar13 & 0xffffffff) != uVar8);
  }
  return;
}

Assistant:

void enable_dma(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/config", pci_addr);
	int fd = check_err(open(path, O_RDWR), "open pci config");
	// write to the command register (offset 4) in the PCIe config space
	// bit 2 is "bus master enable", see PCIe 3.0 specification section 7.5.1.1
	assert(lseek(fd, 4, SEEK_SET) == 4);
	uint16_t dma = 0;
	assert(read(fd, &dma, 2) == 2);
	dma |= 1 << 2;
	assert(lseek(fd, 4, SEEK_SET) == 4);
	assert(write(fd, &dma, 2) == 2);
	check_err(close(fd), "close");
}